

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O0

void stop_follower(CHAR_DATA *ch)

{
  bool bVar1;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var2;
  CHAR_DATA *unaff_retaddr;
  CHAR_DATA *in_stack_00000008;
  undefined1 in_stack_00000018 [16];
  CHAR_DATA *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  if (in_RDI->master == (CHAR_DATA *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)unaff_retaddr,(char *)in_RDI);
    CLogger::Debug<>((CLogger *)ch,(string_view)in_stack_00000018);
  }
  else {
    bVar1 = is_affected_by(in_RDI,in_stack_fffffffffffffff4);
    if (bVar1) {
      _Var2 = std::pow<int,int>(0,0x52a819);
      in_RDI->affected_by[0] = ((long)_Var2 ^ 0xffffffffffffffffU) & in_RDI->affected_by[0];
      affect_strip(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
    }
    bVar1 = can_see(in_stack_00000008,unaff_retaddr);
    if (((bVar1) && (in_RDI->in_room != (ROOM_INDEX_DATA *)0x0)) &&
       ((bVar1 = is_npc(in_stack_ffffffffffffffe8), !bVar1 || (in_RDI->pIndexData->vnum != 0xb8e))))
    {
      act((char *)unaff_retaddr,in_RDI,
          (void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
          in_stack_ffffffffffffffe8,0);
      act((char *)unaff_retaddr,in_RDI,
          (void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
          in_stack_ffffffffffffffe8,0);
      bVar1 = is_affected(in_RDI,(int)gsn_trail);
      if (bVar1) {
        affect_strip(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
      }
    }
    if (in_RDI->master->pet == in_RDI) {
      in_RDI->master->pet = (CHAR_DATA *)0x0;
    }
    check_leadership_affect
              ((CHAR_DATA *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    in_RDI->master = (CHAR_DATA *)0x0;
    in_RDI->leader = (CHAR_DATA *)0x0;
  }
  return;
}

Assistant:

void stop_follower(CHAR_DATA *ch)
{
	if (ch->master == nullptr)
	{
		RS.Logger.Debug("Stop_follower: nullptr master.");
		return;
	}

	if (is_affected_by(ch, AFF_CHARM))
	{
		REMOVE_BIT(ch->affected_by, AFF_CHARM);
		affect_strip(ch, gsn_charm_person);
	}

	if (can_see(ch->master, ch) && ch->in_room != nullptr && !(is_npc(ch) && ch->pIndexData->vnum == MOB_VNUM_ANCHOR))
	{
		act("$n stops following you.", ch, nullptr, ch->master, TO_VICT);
		act("You stop following $N.", ch, nullptr, ch->master, TO_CHAR);

		if (is_affected(ch, gsn_trail))
			affect_strip(ch, gsn_trail);
	}
	if (ch->master->pet == ch)
		ch->master->pet = nullptr;

	check_leadership_affect(ch);
	ch->master = nullptr;
	ch->leader = nullptr;
}